

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O1

void __thiscall camp::UserObject::UserObject(UserObject *this,UserObject *copy)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ParentObject *copy_00;
  UserProperty *pUVar2;
  ParentObject *this_00;
  
  this->m_class = copy->m_class;
  (this->m_holder).
  super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (copy->m_holder).
       super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (copy->m_holder).
           super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_holder).
  super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  copy_00 = (copy->m_parent).px;
  if (copy_00 == (ParentObject *)0x0) {
    this_00 = (ParentObject *)0x0;
  }
  else {
    this_00 = (ParentObject *)operator_new(0x58);
    pUVar2 = copy_00->member;
    UserObject((UserObject *)this_00,&copy_00->object);
    this_00->member = pUVar2;
    UserObject(&this_00->lastValue);
  }
  (this->m_parent).px = this_00;
  if (this_00 != (ParentObject *)0x0) {
    (this_00->object).m_child = this;
  }
  return;
}

Assistant:

UserObject::UserObject(const UserObject& copy)
    : m_class(copy.m_class)
    , m_holder(copy.m_holder)
    , m_parent(copy.m_parent ? new ParentObject(copy.m_parent->object, copy.m_parent->member) : 0)
{
    if (m_parent)
        m_parent->object.m_child = this;
}